

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O2

string * __thiscall
ZXing::Result::sequenceId_abi_cxx11_(string *__return_storage_ptr__,Result *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->_sai).id);
  return __return_storage_ptr__;
}

Assistant:

std::string Result::sequenceId() const
{
	return _sai.id;
}